

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_cache_search(REF_FACELIFT ref_facelift)

{
  int iVar1;
  REF_GEOM ref_geom_00;
  uint uVar2;
  REF_STATUS RVar3;
  REF_SEARCH *ppRVar4;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_INT ref_malloc_init_i_1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_DBL scale;
  REF_DBL radius;
  REF_DBL center [3];
  REF_INT local_a8 [2];
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_INT iface;
  REF_INT nface;
  REF_INT iedge;
  REF_INT nedge;
  REF_FACELIFT ref_facelift_local;
  
  ref_geom_00 = ref_facelift->grid->geom;
  ref_facelift->edge_search = (REF_SEARCH *)0x0;
  iVar1 = ref_geom_00->nedge;
  if (0 < iVar1) {
    unique0x00012000 = ref_facelift->edg_cell;
    if (iVar1 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x40,"ref_facelift_cache_search",
             "malloc ref_facelift->edge_search of REF_SEARCH negative");
      return 1;
    }
    ppRVar4 = (REF_SEARCH *)malloc((long)iVar1 << 3);
    ref_facelift->edge_search = ppRVar4;
    if (ref_facelift->edge_search == (REF_SEARCH *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x40,"ref_facelift_cache_search","malloc ref_facelift->edge_search of REF_SEARCH NULL")
      ;
      return 2;
    }
    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < iVar1;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      ref_facelift->edge_search[ref_private_macro_code_rss_1] = (REF_SEARCH)0x0;
    }
    for (iface = 0; iface < iVar1; iface = iface + 1) {
      uVar2 = ref_search_create(ref_facelift->edge_search + iface,stack0xffffffffffffffc8->n);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x44,"ref_facelift_cache_search",(ulong)uVar2,"create edge search");
        return uVar2;
      }
    }
    for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max; nodes[0x19] = nodes[0x19] + 1)
    {
      RVar3 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],local_a8);
      if (RVar3 == 0) {
        nodes[0] = nodes[(long)stack0xffffffffffffffc8->node_per + -2];
        uVar2 = ref_geom_edg_t_bounding_sphere2(ref_geom_00,local_a8,&radius,&scale);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x4b,"ref_facelift_cache_search",(ulong)uVar2,"bound with circle");
          return uVar2;
        }
        center[0] = 0.0;
        center[1] = 0.0;
        uVar2 = ref_search_insert(ref_facelift->edge_search[nodes[0] + -1],nodes[0x19],&radius,
                                  scale * 2.0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x51,"ref_facelift_cache_search",(ulong)uVar2,"ins");
          return uVar2;
        }
      }
    }
  }
  ref_facelift->face_search = (REF_SEARCH *)0x0;
  iVar1 = ref_geom_00->nface;
  if (0 < iVar1) {
    unique0x00012000 = ref_facelift->tri_cell;
    if (iVar1 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x5c,"ref_facelift_cache_search",
             "malloc ref_facelift->face_search of REF_SEARCH negative");
      return 1;
    }
    ppRVar4 = (REF_SEARCH *)malloc((long)iVar1 << 3);
    ref_facelift->face_search = ppRVar4;
    if (ref_facelift->face_search == (REF_SEARCH *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x5c,"ref_facelift_cache_search","malloc ref_facelift->face_search of REF_SEARCH NULL")
      ;
      return 2;
    }
    for (ref_private_macro_code_rss_4 = 0; ref_private_macro_code_rss_4 < iVar1;
        ref_private_macro_code_rss_4 = ref_private_macro_code_rss_4 + 1) {
      ref_facelift->face_search[ref_private_macro_code_rss_4] = (REF_SEARCH)0x0;
    }
    for (ref_geom._0_4_ = 0; (int)ref_geom < iVar1; ref_geom._0_4_ = (int)ref_geom + 1) {
      uVar2 = ref_search_create(ref_facelift->face_search + (int)ref_geom,stack0xffffffffffffffc8->n
                               );
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x60,"ref_facelift_cache_search",(ulong)uVar2,"create face search");
        return uVar2;
      }
    }
    for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max; nodes[0x19] = nodes[0x19] + 1)
    {
      RVar3 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],local_a8);
      if (RVar3 == 0) {
        nodes[1] = nodes[(long)stack0xffffffffffffffc8->node_per + -2];
        uVar2 = ref_geom_tri_uv_bounding_sphere3(ref_geom_00,local_a8,&radius,&scale);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x67,"ref_facelift_cache_search",(ulong)uVar2,"bound with circle");
          return uVar2;
        }
        center[1] = 0.0;
        uVar2 = ref_search_insert(ref_facelift->face_search[nodes[1] + -1],nodes[0x19],&radius,
                                  scale * 2.0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x6c,"ref_facelift_cache_search",(ulong)uVar2,"ins");
          return uVar2;
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_cache_search(REF_FACELIFT ref_facelift) {
  REF_INT nedge, iedge, nface, iface;
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius, scale = 2.0;

  ref_facelift->edge_search = NULL;

  nedge = ref_geom->nedge;

  if (0 < nedge) {
    ref_cell = ref_facelift_edg(ref_facelift);

    ref_malloc_init(ref_facelift->edge_search, nedge, REF_SEARCH, NULL);
    for (iedge = 0; iedge < nedge; iedge++) {
      RSS(ref_search_create(&(ref_facelift_edge_search(ref_facelift, iedge)),
                            ref_cell_n(ref_cell)),
          "create edge search");
    }

    /* cache each t edg */
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      nodes[2] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
      RSS(ref_geom_edg_t_bounding_sphere2(ref_geom, nodes, center, &radius),
          "bound with circle");
      center[1] = 0.0;
      center[2] = 0.0;
      iedge = nodes[2] - 1;
      RSS(ref_search_insert(ref_facelift_edge_search(ref_facelift, iedge), cell,
                            center, scale * radius),
          "ins");
    }
  }

  ref_facelift->face_search = NULL;

  nface = ref_geom->nface;

  if (0 < nface) {
    ref_cell = ref_facelift_tri(ref_facelift);

    ref_malloc_init(ref_facelift->face_search, nface, REF_SEARCH, NULL);
    for (iface = 0; iface < nface; iface++) {
      RSS(ref_search_create(&(ref_facelift_face_search(ref_facelift, iface)),
                            ref_cell_n(ref_cell)),
          "create face search");
    }

    /* cache each uv tri */
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      nodes[3] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
      RSS(ref_geom_tri_uv_bounding_sphere3(ref_geom, nodes, center, &radius),
          "bound with circle");
      center[2] = 0.0;
      iface = nodes[3] - 1;
      RSS(ref_search_insert(ref_facelift_face_search(ref_facelift, iface), cell,
                            center, scale * radius),
          "ins");
    }
  }

  return REF_SUCCESS;
}